

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O2

void do_aedit(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AREA_DATA_conflict *pAVar5;
  char *pcVar6;
  char arg [4608];
  char value2 [4608];
  char acStack_2428 [4608];
  char local_1228 [4616];
  
  bVar2 = check_security(ch);
  if (!bVar2) {
    return;
  }
  pAVar5 = ch->in_room->area;
  pcVar4 = one_argument(argument,acStack_2428);
  bVar2 = is_number(acStack_2428);
  if (bVar2) {
    iVar3 = atoi(acStack_2428);
    pAVar5 = get_area_data(iVar3);
    if (pAVar5 == (AREA_DATA_conflict *)0x0) {
      pcVar4 = "That area vnum does not exist.\n\r";
      goto LAB_00399690;
    }
  }
  else {
    bVar2 = str_cmp(acStack_2428,"create");
    if (!bVar2) {
      bVar2 = is_npc(ch);
      if ((!bVar2) && (ch->pcdata->security < 9)) {
        pcVar4 = "You do not have the access to create areas.\n\r";
        goto LAB_00399690;
      }
      one_argument(pcVar4,local_1228);
      iVar3 = atoi(local_1228);
      pAVar5 = get_area_data(iVar3);
      if (pAVar5 != (AREA_DATA_conflict *)0x0) {
        pcVar4 = "That area already exists!";
        goto LAB_00399690;
      }
      pAVar5 = new_area();
      area_last->next = pAVar5;
      area_last = pAVar5;
      *(byte *)pAVar5->area_flags = (byte)pAVar5->area_flags[0] | 0x10;
      send_to_char("Area created.\n\r",ch);
    }
  }
  bVar2 = is_switched(ch);
  if (!bVar2) {
    if (pAVar5->security < ch->pcdata->security) {
LAB_003996df:
      pDVar1 = ch->desc;
      pDVar1->pEdit = pAVar5;
      pDVar1->editor = 1;
      aedit_show(ch,"");
      return;
    }
    pcVar4 = pAVar5->builders;
    pcVar6 = strstr(pcVar4,ch->name);
    if ((pcVar6 != (char *)0x0) || (pcVar4 = strstr(pcVar4,"All"), pcVar4 != (char *)0x0))
    goto LAB_003996df;
  }
  pcVar4 = "You have insufficent security to edit that area.\n\r";
LAB_00399690:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_aedit(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	int value;
	char value2[MAX_STRING_LENGTH];
	char arg[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	pArea = ch->in_room->area;

	argument = one_argument(argument, arg);

	if (is_number(arg))
	{
		value = atoi(arg);
		if (!(pArea = get_area_data(value)))
		{
			send_to_char("That area vnum does not exist.\n\r", ch);
			return;
		}
	}
	else
	{
		if (!str_cmp(arg, "create"))
		{
			if (!is_npc(ch) && (ch->pcdata->security < 9))
			{
				send_to_char("You do not have the access to create areas.\n\r", ch);
				return;
			}

			argument = one_argument(argument, value2);
			value = atoi(value2);

			if (get_area_data(value) != nullptr)
			{
				send_to_char("That area already exists!", ch);
				return;
			}

			pArea = new_area();
			area_last->next = pArea;
			area_last = pArea; /* Thanks, Walker. */

			SET_BIT(pArea->area_flags, AREA_ADDED);

			send_to_char("Area created.\n\r", ch);
		}
	}

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("You have insufficent security to edit that area.\n\r", ch);
		return;
	}

	ch->desc->pEdit = (void *)pArea;
	ch->desc->editor = ED_AREA;

	aedit_show(ch, "");
}